

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_container_is_subset_bitset(run_container_t *container1,bitset_container_t *container2)

{
  _Bool _Var1;
  int iVar2;
  int32_t n_runs;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  
  iVar6 = container2->cardinality;
  if (iVar6 == -1) {
    iVar6 = bitset_container_compute_cardinality(container2);
    lVar3 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar3 + 4) & 0x20) == 0) {
      iVar2 = container1->n_runs;
      lVar3 = (long)iVar2;
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          iVar2 = iVar2 + (uint)container1->runs[lVar4].length;
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      goto LAB_0010ecab;
    }
  }
  else {
    lVar3 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar3 + 4) & 0x20) == 0) {
      iVar2 = container1->n_runs;
      lVar3 = (long)iVar2;
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          iVar2 = iVar2 + (uint)container1->runs[lVar4].length;
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      goto LAB_0010ecab;
    }
  }
  iVar2 = _avx2_run_container_cardinality(container1);
LAB_0010ecab:
  if (iVar6 < iVar2) {
LAB_0010ecaf:
    _Var1 = false;
  }
  else {
    _Var1 = true;
    if (0 < (long)container1->n_runs) {
      lVar3 = 0;
      do {
        uVar5 = (ulong)container1->runs[lVar3].value;
        iVar6 = container1->runs[lVar3].length + 1;
        do {
          if ((*(ulong *)((long)container2->words + (ulong)((uint)(uVar5 >> 3) & 0x1ff8)) >>
               (uVar5 & 0x3f) & 1) == 0) goto LAB_0010ecaf;
          uVar5 = (ulong)((int)uVar5 + 1);
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
        lVar3 = lVar3 + 1;
      } while (lVar3 != container1->n_runs);
    }
  }
  return _Var1;
}

Assistant:

bool run_container_is_subset_bitset(const run_container_t* container1,
                                    const bitset_container_t* container2) {
    // todo: this code could be much faster
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality < run_container_cardinality(container1)) {
            return false;
        }
    } else {
        int32_t card = bitset_container_compute_cardinality(
            container2);  // modify container2?
        if (card < run_container_cardinality(container1)) {
            return false;
        }
    }
    for (int i = 0; i < container1->n_runs; ++i) {
        uint32_t run_start = container1->runs[i].value;
        uint32_t le = container1->runs[i].length;
        for (uint32_t j = run_start; j <= run_start + le; ++j) {
            if (!bitset_container_contains(container2, j)) {
                return false;
            }
        }
    }
    return true;
}